

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,Matrix<double,__1,__1,_0,__1,__1> *lhs,
               Matrix<double,__1,_1,_0,__1,_1> *rhs,Scalar *alpha)

{
  double dVar1;
  Index IVar2;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>> *this;
  Scalar *pSVar3;
  ReturnType RVar4;
  RhsNested actual_rhs;
  LhsNested actual_lhs;
  ConstRowXpr local_60;
  double *local_28;
  Scalar *alpha_local;
  Matrix<double,__1,_1,_0,__1,_1> *rhs_local;
  Matrix<double,__1,__1,_0,__1,__1> *lhs_local;
  Matrix<double,__1,_1,_0,__1,_1> *dst_local;
  
  local_28 = alpha;
  alpha_local = (Scalar *)rhs;
  rhs_local = (Matrix<double,__1,_1,_0,__1,_1> *)lhs;
  lhs_local = (Matrix<double,__1,__1,_0,__1,__1> *)dst;
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if ((IVar2 == 1) &&
     (IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)alpha_local),
     IVar2 == 1)) {
    dVar1 = *local_28;
    DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_60,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)rhs_local,0);
    this = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>> *)
           DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
           conjugate((DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                      *)&local_60);
    DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::col
              ((ConstColXpr *)&actual_lhs,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)alpha_local,0);
    RVar4 = MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>>::
            dot<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,true>>
                      (this,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
                             *)&actual_lhs);
    pSVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeffRef
                       ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)lhs_local,0,0);
    *pSVar3 = dVar1 * RVar4 + *pSVar3;
    return;
  }
  gemv_dense_selector<2,0,true>::
  run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)rhs_local,
             (Matrix<double,__1,_1,_0,__1,_1> *)alpha_local,
             (Matrix<double,__1,_1,_0,__1,_1> *)lhs_local,local_28);
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }